

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O0

void BinaryCache::AddImportPath(char *path)

{
  undefined *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char **ppcVar5;
  size_t sVar6;
  char *local_20;
  char *importPath;
  char *pcStack_10;
  uint i;
  char *path_local;
  
  importPath._4_4_ = 0;
  pcStack_10 = path;
  while( true ) {
    uVar2 = importPath._4_4_;
    uVar3 = FastVector<char_*,_false,_false>::size((FastVector<char_*,_false,_false> *)importPaths);
    puVar1 = NULLC::alloc;
    if (uVar3 <= uVar2) {
      sVar6 = strlen(pcStack_10);
      local_20 = (char *)(*(code *)puVar1)((int)sVar6 + 1);
      strcpy(local_20,pcStack_10);
      FastVector<char_*,_false,_false>::push_back
                ((FastVector<char_*,_false,_false> *)importPaths,&local_20);
      return;
    }
    ppcVar5 = FastVector<char_*,_false,_false>::operator[]
                        ((FastVector<char_*,_false,_false> *)importPaths,importPath._4_4_);
    iVar4 = strcmp(*ppcVar5,pcStack_10);
    if (iVar4 == 0) break;
    importPath._4_4_ = importPath._4_4_ + 1;
  }
  return;
}

Assistant:

void BinaryCache::AddImportPath(const char* path)
{
	for(unsigned int i = 0; i < importPaths.size(); i++)
	{
		if(strcmp(importPaths[i], path) == 0)
			return;
	}

	char *importPath = (char*)NULLC::alloc(int(strlen(path)) + 1);
	strcpy(importPath, path);
	importPaths.push_back(importPath);
}